

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV4MeshBones(Parser *this,uint iNumBones,Mesh *mesh)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  value_type local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"UNNAMED","");
  paVar1 = &local_70.mName.field_2;
  local_70.mName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_50,local_50 + local_48);
  std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::resize
            (&mesh->mBones,(ulong)iNumBones,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.mName._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.mName._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  iVar7 = 0;
LAB_003e5c5a:
  do {
    pcVar3 = this->filePtr;
    if (*pcVar3 == '*') {
      this->filePtr = pcVar3 + 1;
      iVar5 = strncmp("MESH_BONE_NAME",pcVar3 + 1,0xe);
      if (iVar5 == 0) {
        bVar2 = pcVar3[0xf];
        if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
          pbVar8 = (byte *)(pcVar3 + 0x10);
          if (bVar2 == 0) {
            pbVar8 = (byte *)(pcVar3 + 0xf);
          }
          this->filePtr = (char *)pbVar8;
          for (; (*pbVar8 == 0x20 || (*pbVar8 == 9)); pbVar8 = pbVar8 + 1) {
          }
          this->filePtr = (char *)pbVar8;
          bVar2 = *pbVar8;
          if ((0xd < bVar2) || ((0x3401U >> (bVar2 & 0x1f) & 1) == 0)) {
            uVar6 = 0;
            if (0xf5 < (byte)(bVar2 - 0x3a)) {
              uVar6 = 0;
              do {
                uVar6 = (uint)(byte)(bVar2 - 0x30) + uVar6 * 10;
                bVar2 = pbVar8[1];
                pbVar8 = pbVar8 + 1;
              } while (0xf5 < (byte)(bVar2 - 0x3a));
            }
            this->filePtr = (char *)pbVar8;
            if (uVar6 < iNumBones) {
              bVar4 = ParseString(this,&(mesh->mBones).
                                        super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar6].mName,
                                  "*MESH_BONE_NAME");
              if (!bVar4) {
                SkipToNextToken(this);
              }
            }
            else {
              LogWarning(this,"Bone index is out of bounds");
            }
            goto LAB_003e5c5a;
          }
        }
      }
    }
    pbVar8 = (byte *)this->filePtr;
    bVar2 = *pbVar8;
    uVar6 = (uint)bVar2;
    if (bVar2 == 0x7b) {
      iVar7 = iVar7 + 1;
    }
    else if (bVar2 == 0x7d) {
      iVar7 = iVar7 + -1;
      if (iVar7 == 0) {
        this->filePtr = (char *)(pbVar8 + 1);
        SkipToNextToken(this);
        return;
      }
    }
    else if (uVar6 == 0) {
      LogError(this,"Encountered unexpected EOL while parsing a *MESH_BONE_LIST chunk (Level 3)");
    }
    if (((uVar6 < 0xe) && ((0x3401U >> (uVar6 & 0x1f) & 1) != 0)) &&
       (this->bLastWasEndLine == false)) {
      this->iLineNumber = this->iLineNumber + 1;
      this->bLastWasEndLine = true;
    }
    else {
      this->bLastWasEndLine = false;
    }
    this->filePtr = (char *)(pbVar8 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV4MeshBones(unsigned int iNumBones,ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();
    mesh.mBones.resize(iNumBones, Bone("UNNAMED"));
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Mesh bone with name ...
            if (TokenMatch(filePtr,"MESH_BONE_NAME" ,14))
            {
                // parse an index ...
                if(SkipSpaces(&filePtr))
                {
                    unsigned int iIndex = strtoul10(filePtr,&filePtr);
                    if (iIndex >= iNumBones)
                    {
                        LogWarning("Bone index is out of bounds");
                        continue;
                    }
                    if (!ParseString(mesh.mBones[iIndex].mName,"*MESH_BONE_NAME"))
                        SkipToNextToken();
                    continue;
                }
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_BONE_LIST");
    }
}